

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O0

void Rtm_ObjTransferToBig(Rtm_Man_t *p,Rtm_Edg_t *pEdge)

{
  int iVar1;
  uint *local_28;
  int nExtraAllocNew;
  Rtm_Edg_t *pEdge_local;
  Rtm_Man_t *p_local;
  
  if (((ulong)*pEdge & 0xfff) == 10) {
    if (p->nExtraAlloc < p->nExtraCur + 1) {
      iVar1 = Abc_MaxInt(p->nExtraAlloc << 1,0x400);
      if (p->pExtra == (uint *)0x0) {
        local_28 = (uint *)malloc((long)iVar1 << 2);
      }
      else {
        local_28 = (uint *)realloc(p->pExtra,(long)iVar1 << 2);
      }
      p->pExtra = local_28;
      p->nExtraAlloc = iVar1;
    }
    p->pExtra[p->nExtraCur] = *(uint *)pEdge >> 0xc;
    iVar1 = p->nExtraCur;
    p->nExtraCur = iVar1 + 1;
    *(uint *)pEdge = *(uint *)pEdge & 0xfff | iVar1 << 0xc;
    return;
  }
  __assert_fail("pEdge->nLats == 10",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigRet.c"
                ,0xb0,"void Rtm_ObjTransferToBig(Rtm_Man_t *, Rtm_Edg_t *)");
}

Assistant:

void Rtm_ObjTransferToBig( Rtm_Man_t * p, Rtm_Edg_t * pEdge ) 
{
    assert( pEdge->nLats == 10 );
    if ( p->nExtraCur + 1 > p->nExtraAlloc )
    {
        int nExtraAllocNew = Abc_MaxInt( 2 * p->nExtraAlloc, 1024 );
        p->pExtra = ABC_REALLOC( unsigned, p->pExtra, nExtraAllocNew );
        p->nExtraAlloc = nExtraAllocNew;
    }
    p->pExtra[p->nExtraCur] = pEdge->LData;
    pEdge->LData = p->nExtraCur++;
}